

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

SNode * find_SNode(Parser *p,uint state,D_Scope *sc)

{
  SNode *local_40;
  SNode *result;
  SNode *pSStack_30;
  uint h;
  SNode *sn;
  SNodeHash *ph;
  D_Scope *sc_local;
  uint state_local;
  Parser *p_local;
  
  local_40 = (SNode *)0x0;
  if ((p->snode_hash).v != (SNode **)0x0) {
    for (pSStack_30 = (p->snode_hash).v
                      [(ulong)(state * 0x1000 + (int)sc) % (ulong)(p->snode_hash).m];
        pSStack_30 != (SNode *)0x0; pSStack_30 = pSStack_30->bucket_next) {
      if ((((long)pSStack_30->state - (long)p->t->state) / 0x78 == (ulong)state) &&
         (pSStack_30->initial_scope == sc)) {
        if (local_40 != (SNode *)0x0) {
          __assert_fail("!result",
                        "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/parse.c"
                        ,0x98,"SNode *find_SNode(Parser *, uint, D_Scope *)");
        }
        local_40 = pSStack_30;
      }
    }
  }
  return local_40;
}

Assistant:

SNode *find_SNode(Parser *p, uint state, D_Scope *sc) {
  SNodeHash *ph = &p->snode_hash;
  SNode *sn;
  uint h = SNODE_HASH(state, sc);
  SNode *result = NULL;
  if (ph->v)
    for (sn = ph->v[h % ph->m]; sn; sn = sn->bucket_next)
      if (sn->state - p->t->state == state && sn->initial_scope == sc) {
        assert(!result);
        result = sn;
      }
  return result;
}